

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O3

void lj_ccallback_leave(CTState *cts,TValue *o)

{
  lua_State *plVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  uint uVar4;
  CType *d;
  FPRCBArg *dp;
  
  plVar1 = cts->L;
  pTVar2 = plVar1->base;
  pTVar3 = plVar1->top;
  plVar1->base = pTVar3;
  if ((pTVar3 <= o) && (*(char *)((ulong)pTVar3[-1].u32.lo + 6) == '\0')) {
    uVar4 = *(uint *)((ulong)pTVar3[-1].u32.lo + 0x10);
    *(uint *)((long)plVar1->cframe + 0x1c) = uVar4 + *(int *)((ulong)uVar4 - 0x38) * 4 + 4;
  }
  uVar4 = cts->tab[*(ushort *)((long)pTVar3 - 0xc)].info;
  if ((uVar4 & 0xf0000000) != 0x40000000) {
    d = cts->tab + *(ushort *)((long)pTVar3 - 0xc);
    dp = (cts->cb).fpr + (ulong)((uVar4 & 0xf4000000) != 0x4000000) * 8;
    lj_cconv_ct_tv(cts,d,(uint8_t *)dp,o,0);
    if (((d->info & 0xf4000000) == 0) && (uVar4 = d->size, uVar4 < 4)) {
      if ((d->info >> 0x17 & 1) == 0) {
        if (uVar4 == 1) {
          uVar4 = (uint)(char)*(byte *)dp;
        }
        else {
          uVar4 = (uint)(short)*(ushort *)dp;
        }
      }
      else if (uVar4 == 1) {
        uVar4 = (uint)*(byte *)dp;
      }
      else {
        uVar4 = (uint)*(ushort *)dp;
      }
      *(uint *)dp = uVar4;
    }
  }
  plVar1->top = plVar1->top + -2;
  plVar1->base = pTVar2;
  plVar1->cframe = *(void **)((long)plVar1->cframe + 0x30);
  (cts->cb).slot = 0;
  return;
}

Assistant:

void LJ_FASTCALL lj_ccallback_leave(CTState *cts, TValue *o)
{
  lua_State *L = cts->L;
  GCfunc *fn;
  TValue *obase = L->base;
  L->base = L->top;  /* Keep continuation frame for throwing errors. */
  if (o >= L->base) {
    /* PC of RET* is lost. Point to last line for result conv. errors. */
    fn = curr_func(L);
    if (isluafunc(fn)) {
      GCproto *pt = funcproto(fn);
      setcframe_pc(L->cframe, proto_bc(pt)+pt->sizebc+1);
    }
  }
  callback_conv_result(cts, L, o);
  /* Finally drop C frame and continuation frame. */
  L->top -= 2+2*LJ_FR2;
  L->base = obase;
  L->cframe = cframe_prev(L->cframe);
  cts->cb.slot = 0;  /* Blacklist C function that called the callback. */
}